

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O1

qpTestResult
glu::TextureTestUtil::compareGenMipmapResult
          (TestLog *log,Texture2D *resultTexture,Texture2D *level0Reference,
          GenMipmapPrecision *precision)

{
  ostringstream *poVar1;
  bool bVar2;
  int i;
  int iVar3;
  long lVar4;
  Vec4 *pVVar5;
  pointer pPVar6;
  undefined8 *puVar7;
  long *plVar8;
  Vec4 *pVVar9;
  GenMipmapPrecision *pGVar10;
  size_type *psVar11;
  ConstPixelBufferAccess *access;
  Surface *surface;
  void *__buf;
  void *__buf_00;
  ulong uVar12;
  Vec4 *pVVar13;
  void *pvVar14;
  qpTestResult qVar15;
  ulong unaff_R13;
  qpTestResult qVar16;
  Surface errorMask;
  Vec4 threshold;
  ConstPixelBufferAccess dst;
  ConstPixelBufferAccess src;
  string local_3b8;
  long local_398;
  Surface local_390;
  long *local_378;
  undefined8 local_370;
  long local_368;
  undefined8 uStack_360;
  Texture2D *local_358;
  uint local_34c;
  LogImageSet local_348;
  ulong *local_300;
  long local_2f8;
  ulong local_2f0 [2];
  ulong *local_2e0;
  long local_2d8;
  ulong local_2d0 [2];
  ulong *local_2c0;
  long local_2b8;
  ulong local_2b0 [2];
  ulong *local_2a0;
  long local_298;
  ulong local_290 [2];
  GenMipmapPrecision *local_280;
  string local_278;
  string local_258;
  string local_238;
  long local_218;
  long local_210;
  long local_208;
  ConstPixelBufferAccess local_200;
  ConstPixelBufferAccess local_1d8;
  undefined1 local_1b0 [16];
  TestLog local_1a0 [2];
  long *local_190;
  long local_180 [8];
  ios_base local_140 [8];
  ios_base local_138 [264];
  
  lVar4 = 0;
  do {
    *(undefined4 *)(local_1b0 + lVar4 * 4) = 0x3f800000;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  pVVar5 = &precision->colorThreshold;
  local_348.m_name._M_dataplus._M_p = (pointer)0x0;
  local_348.m_name._M_string_length = 0;
  pVVar9 = (Vec4 *)local_1b0;
  lVar4 = 0;
  do {
    pVVar13 = pVVar5;
    if ((precision->colorMask).m_data[lVar4] == false) {
      pVVar13 = pVVar9;
    }
    *(float *)((long)&local_348.m_name._M_dataplus._M_p + lVar4 * 4) = pVVar13->m_data[0];
    lVar4 = lVar4 + 1;
    pVVar9 = (Vec4 *)(pVVar9->m_data + 1);
    pVVar5 = (Vec4 *)(pVVar5->m_data + 1);
  } while (lVar4 != 4);
  local_358 = resultTexture;
  bVar2 = tcu::floatThresholdCompare
                    (log,"Level0","Level 0",
                     &((level0Reference->super_TextureLevelPyramid).m_access.
                       super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                       ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess,
                     &((resultTexture->super_TextureLevelPyramid).m_access.
                       super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                       ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess,
                     (Vec4 *)&local_348,COMPARE_LOG_RESULT);
  if (!bVar2) {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"ERROR: Level 0 comparison failed!",0x21);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
  }
  qVar15 = (qpTestResult)!bVar2;
  pPVar6 = (local_358->super_TextureLevelPyramid).m_access.
           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (1 < (int)((ulong)((long)(local_358->super_TextureLevelPyramid).m_access.
                              super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar6) >> 3) *
          -0x33333333) {
    local_398 = 1;
    local_208 = 0x30;
    local_210 = 0x3c;
    local_218 = 0;
    local_280 = precision;
    do {
      pGVar10 = local_280;
      local_1d8.m_format = *(TextureFormat *)(pPVar6 + local_398 + -1);
      lVar4 = 2;
      do {
        local_1d8.m_size.m_data[lVar4 + -2] =
             *(int *)((long)(pPVar6->super_ConstPixelBufferAccess).m_size.m_data +
                     lVar4 * 4 + local_218 + -8);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 5);
      lVar4 = 5;
      do {
        local_1d8.m_size.m_data[lVar4 + -2] =
             *(int *)((long)(pPVar6->super_ConstPixelBufferAccess).m_size.m_data +
                     lVar4 * 4 + local_218 + -8);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 8);
      local_1d8.m_data = pPVar6[local_398 + -1].super_ConstPixelBufferAccess.m_data;
      local_200.m_format = *(TextureFormat *)(pPVar6 + local_398);
      lVar4 = 0;
      do {
        local_200.m_size.m_data[lVar4] =
             *(int *)((long)(pPVar6->super_ConstPixelBufferAccess).m_size.m_data +
                     lVar4 * 4 + local_208 + -8);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      lVar4 = 0;
      do {
        local_200.m_pitch.m_data[lVar4] =
             *(int *)((long)(pPVar6->super_ConstPixelBufferAccess).m_size.m_data +
                     lVar4 * 4 + local_210 + -8);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      local_200.m_data = *(void **)((TextureFormat *)(pPVar6 + local_398) + 4);
      tcu::Surface::Surface(&local_390,local_200.m_size.m_data[0],local_200.m_size.m_data[1]);
      local_348.m_name._M_dataplus._M_p = (pointer)0x300000008;
      pvVar14 = (void *)local_390.m_pixels.m_cap;
      if ((void *)local_390.m_pixels.m_cap != (void *)0x0) {
        pvVar14 = local_390.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_1b0,(TextureFormat *)&local_348,local_390.m_width,
                 local_390.m_height,1,pvVar14);
      iVar3 = compareGenMipmapBilinear(&local_200,&local_1d8,(PixelBufferAccess *)local_1b0,pGVar10)
      ;
      if (iVar3 == 0) {
        unaff_R13 = CONCAT71((int7)(unaff_R13 >> 8),1);
      }
      else {
        poVar1 = (ostringstream *)(local_1b0 + 8);
        local_1b0._0_8_ = log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"WARNING: Level ",0xf);
        std::ostream::operator<<(poVar1,(int)local_398);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1," comparison to bilinear method failed, found ",0x2d);
        std::ostream::operator<<(poVar1,iVar3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1," invalid pixels.",0x10);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
        unaff_R13 = 0;
      }
      if ((char)unaff_R13 == '\0') {
        local_34c = (uint)unaff_R13;
        local_348.m_name._M_dataplus._M_p = (pointer)0x300000008;
        pvVar14 = (void *)local_390.m_pixels.m_cap;
        if ((void *)local_390.m_pixels.m_cap != (void *)0x0) {
          pvVar14 = local_390.m_pixels.m_ptr;
        }
        tcu::PixelBufferAccess::PixelBufferAccess
                  ((PixelBufferAccess *)local_1b0,(TextureFormat *)&local_348,local_390.m_width,
                   local_390.m_height,1,pvVar14);
        lVar4 = local_398;
        iVar3 = compareGenMipmapBox(&local_200,&local_1d8,(PixelBufferAccess *)local_1b0,local_280);
        if (iVar3 == 0) {
          unaff_R13 = CONCAT71((int7)((ulong)lVar4 >> 8),1);
        }
        else {
          poVar1 = (ostringstream *)(local_1b0 + 8);
          local_1b0._0_8_ = log;
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"WARNING: Level ",0xf);
          std::ostream::operator<<(poVar1,(int)lVar4);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1," comparison to box method failed, found ",0x28);
          std::ostream::operator<<(poVar1,iVar3);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1," invalid pixels.",0x10);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          std::ios_base::~ios_base(local_138);
          unaff_R13 = (ulong)local_34c;
        }
      }
      qVar16 = QP_TEST_RESULT_QUALITY_WARNING;
      if (qVar15 != QP_TEST_RESULT_PASS) {
        qVar16 = qVar15;
      }
      if ((char)unaff_R13 == '\0') {
        local_348.m_name._M_dataplus._M_p = (pointer)0x300000008;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        pvVar14 = (void *)local_390.m_pixels.m_cap;
        if ((void *)local_390.m_pixels.m_cap != (void *)0x0) {
          pvVar14 = local_390.m_pixels.m_ptr;
        }
        pGVar10 = (GenMipmapPrecision *)(ulong)(uint)local_390.m_height;
        tcu::PixelBufferAccess::PixelBufferAccess
                  ((PixelBufferAccess *)local_1b0,(TextureFormat *)&local_348,local_390.m_width,
                   local_390.m_height,1,pvVar14);
        iVar3 = compareGenMipmapVeryLenient
                          (&local_200,&local_1d8,(PixelBufferAccess *)local_1b0,pGVar10);
        qVar15 = qVar16;
        if (iVar3 == 0) {
          unaff_R13 = CONCAT71((int7)(unaff_R13 >> 8),1);
        }
        else {
          local_1b0._0_8_ = log;
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"ERROR: Level ",0xd);
          std::ostream::operator<<(poVar1,(int)local_398);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1," appears to contain ",0x14);
          std::ostream::operator<<(poVar1,iVar3);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1," completely wrong pixels, failing case!",0x27);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          std::ios_base::~ios_base(local_138);
        }
      }
      if ((char)unaff_R13 == '\0') {
        qVar15 = QP_TEST_RESULT_FAIL;
      }
      local_2e0 = local_2d0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"Level","");
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
      std::ostream::operator<<((MessageBuilder *)local_1b0,(int)local_398);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
      std::ios_base::~ios_base(local_140);
      uVar12 = 0xf;
      if (local_2e0 != local_2d0) {
        uVar12 = local_2d0[0];
      }
      if (uVar12 < (ulong)(local_298 + local_2d8)) {
        uVar12 = 0xf;
        if (local_2a0 != local_290) {
          uVar12 = local_290[0];
        }
        if (uVar12 < (ulong)(local_298 + local_2d8)) goto LAB_00a4fb5f;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_2a0,0,(char *)0x0,(ulong)local_2e0);
      }
      else {
LAB_00a4fb5f:
        puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)local_2a0);
      }
      local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
      psVar11 = puVar7 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_3b8.field_2._M_allocated_capacity = *psVar11;
        local_3b8.field_2._8_4_ = *(undefined4 *)(puVar7 + 3);
        local_3b8.field_2._12_4_ = *(undefined4 *)((long)puVar7 + 0x1c);
      }
      else {
        local_3b8.field_2._M_allocated_capacity = *psVar11;
        local_3b8._M_dataplus._M_p = (pointer)*puVar7;
      }
      local_3b8._M_string_length = puVar7[1];
      *puVar7 = psVar11;
      puVar7[1] = 0;
      *(undefined1 *)psVar11 = 0;
      local_300 = local_2f0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"Level ","");
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
      std::ostream::operator<<((MessageBuilder *)local_1b0,(int)local_398);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
      std::ios_base::~ios_base(local_140);
      uVar12 = 0xf;
      if (local_300 != local_2f0) {
        uVar12 = local_2f0[0];
      }
      if (uVar12 < (ulong)(local_2b8 + local_2f8)) {
        uVar12 = 0xf;
        if (local_2c0 != local_2b0) {
          uVar12 = local_2b0[0];
        }
        if (uVar12 < (ulong)(local_2b8 + local_2f8)) goto LAB_00a4fc9f;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_2c0,0,(char *)0x0,(ulong)local_300);
      }
      else {
LAB_00a4fc9f:
        puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_300,(ulong)local_2c0);
      }
      local_378 = &local_368;
      plVar8 = puVar7 + 2;
      if ((long *)*puVar7 == plVar8) {
        local_368 = *plVar8;
        uStack_360 = puVar7[3];
      }
      else {
        local_368 = *plVar8;
        local_378 = (long *)*puVar7;
      }
      local_370 = puVar7[1];
      *puVar7 = plVar8;
      puVar7[1] = 0;
      *(undefined1 *)plVar8 = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_378);
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      psVar11 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_278.field_2._M_allocated_capacity = *psVar11;
        local_278.field_2._8_8_ = plVar8[3];
      }
      else {
        local_278.field_2._M_allocated_capacity = *psVar11;
        local_278._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_278._M_string_length = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      tcu::LogImageSet::LogImageSet(&local_348,&local_3b8,&local_278);
      tcu::TestLog::startImageSet
                (log,local_348.m_name._M_dataplus._M_p,local_348.m_description._M_dataplus._M_p);
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"Result","");
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"Result","");
      access = &local_200;
      tcu::LogImage::LogImage
                ((LogImage *)local_1b0,&local_258,&local_238,access,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)local_1b0,(int)log,__buf,(size_t)access);
      if (local_190 != local_180) {
        operator_delete(local_190,local_180[0] + 1);
      }
      if ((TestLog *)local_1b0._0_8_ != local_1a0) {
        operator_delete((void *)local_1b0._0_8_,(ulong)((long)&(local_1a0[0].m_log)->flags + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348.m_description._M_dataplus._M_p != &local_348.m_description.field_2) {
        operator_delete(local_348.m_description._M_dataplus._M_p,
                        local_348.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348.m_name._M_dataplus._M_p != &local_348.m_name.field_2) {
        operator_delete(local_348.m_name._M_dataplus._M_p,
                        local_348.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      if (local_378 != &local_368) {
        operator_delete(local_378,local_368 + 1);
      }
      if (local_2c0 != local_2b0) {
        operator_delete(local_2c0,local_2b0[0] + 1);
      }
      if (local_300 != local_2f0) {
        operator_delete(local_300,local_2f0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
        operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
      }
      if (local_2a0 != local_290) {
        operator_delete(local_2a0,local_290[0] + 1);
      }
      if (local_2e0 != local_2d0) {
        operator_delete(local_2e0,local_2d0[0] + 1);
      }
      if ((char)unaff_R13 == '\0') {
        local_348.m_name._M_dataplus._M_p = (pointer)&local_348.m_name.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"ErrorMask","");
        local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"Error mask","");
        surface = &local_390;
        tcu::LogImage::LogImage
                  ((LogImage *)local_1b0,&local_348.m_name,&local_3b8,surface,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)local_1b0,(int)log,__buf_00,(size_t)surface);
        if (local_190 != local_180) {
          operator_delete(local_190,local_180[0] + 1);
        }
        if ((TestLog *)local_1b0._0_8_ != local_1a0) {
          operator_delete((void *)local_1b0._0_8_,(ulong)((long)&(local_1a0[0].m_log)->flags + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
          operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348.m_name._M_dataplus._M_p != &local_348.m_name.field_2) {
          operator_delete(local_348.m_name._M_dataplus._M_p,
                          local_348.m_name.field_2._M_allocated_capacity + 1);
        }
      }
      tcu::TestLog::endImageSet(log);
      tcu::Surface::~Surface(&local_390);
      local_398 = local_398 + 1;
      pPVar6 = (local_358->super_TextureLevelPyramid).m_access.
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_218 = local_218 + 0x28;
      local_208 = local_208 + 0x28;
      local_210 = local_210 + 0x28;
    } while (local_398 <
             (int)((ulong)((long)(local_358->super_TextureLevelPyramid).m_access.
                                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar6) >> 3) *
             -0x33333333);
  }
  return qVar15;
}

Assistant:

qpTestResult compareGenMipmapResult (tcu::TestLog& log, const tcu::Texture2D& resultTexture, const tcu::Texture2D& level0Reference, const GenMipmapPrecision& precision)
{
	qpTestResult result = QP_TEST_RESULT_PASS;

	// Special comparison for level 0.
	{
		const tcu::Vec4		threshold	= select(precision.colorThreshold, tcu::Vec4(1.0f), precision.colorMask);
		const bool			level0Ok	= tcu::floatThresholdCompare(log, "Level0", "Level 0", level0Reference.getLevel(0), resultTexture.getLevel(0), threshold, tcu::COMPARE_LOG_RESULT);

		if (!level0Ok)
		{
			log << tcu::TestLog::Message << "ERROR: Level 0 comparison failed!" << tcu::TestLog::EndMessage;
			result = QP_TEST_RESULT_FAIL;
		}
	}

	for (int levelNdx = 1; levelNdx < resultTexture.getNumLevels(); levelNdx++)
	{
		const tcu::ConstPixelBufferAccess	src			= resultTexture.getLevel(levelNdx-1);
		const tcu::ConstPixelBufferAccess	dst			= resultTexture.getLevel(levelNdx);
		tcu::Surface						errorMask	(dst.getWidth(), dst.getHeight());
		bool								levelOk		= false;

		// Try different comparisons in quality order.

		if (!levelOk)
		{
			const int numFailed = compareGenMipmapBilinear(dst, src, errorMask.getAccess(), precision);
			if (numFailed == 0)
				levelOk = true;
			else
				log << tcu::TestLog::Message << "WARNING: Level " << levelNdx << " comparison to bilinear method failed, found " << numFailed << " invalid pixels." << tcu::TestLog::EndMessage;
		}

		if (!levelOk)
		{
			const int numFailed = compareGenMipmapBox(dst, src, errorMask.getAccess(), precision);
			if (numFailed == 0)
				levelOk = true;
			else
				log << tcu::TestLog::Message << "WARNING: Level " << levelNdx << " comparison to box method failed, found " << numFailed << " invalid pixels." << tcu::TestLog::EndMessage;
		}

		// At this point all high-quality methods have been used.
		if (!levelOk && result == QP_TEST_RESULT_PASS)
			result = QP_TEST_RESULT_QUALITY_WARNING;

		if (!levelOk)
		{
			const int numFailed = compareGenMipmapVeryLenient(dst, src, errorMask.getAccess(), precision);
			if (numFailed == 0)
				levelOk = true;
			else
				log << tcu::TestLog::Message << "ERROR: Level " << levelNdx << " appears to contain " << numFailed << " completely wrong pixels, failing case!" << tcu::TestLog::EndMessage;
		}

		if (!levelOk)
			result = QP_TEST_RESULT_FAIL;

		log << tcu::TestLog::ImageSet(string("Level") + de::toString(levelNdx), string("Level ") + de::toString(levelNdx) + " result")
			<< tcu::TestLog::Image("Result", "Result", dst);

		if (!levelOk)
			log << tcu::TestLog::Image("ErrorMask", "Error mask", errorMask);

		log << tcu::TestLog::EndImageSet;
	}

	return result;
}